

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O1

void __thiscall
TPZMHMeshControl::SetSubdomain(TPZMHMeshControl *this,TPZCompEl *cel,int64_t subdomain)

{
  long lVar1;
  int iVar2;
  int64_t cindex;
  TPZCompMesh *cmesh;
  TPZGeoEl *pTVar3;
  int iVar4;
  long local_38;
  
  iVar2 = (**(code **)(*(long *)cel + 0x90))(cel);
  if (0 < iVar2) {
    iVar4 = 0;
    do {
      cindex = (**(code **)(*(long *)cel + 0xa0))(cel,iVar4);
      cmesh = TPZCompEl::Mesh(cel);
      SetSubdomain(this,cmesh,cindex,subdomain);
      iVar4 = iVar4 + 1;
    } while (iVar2 != iVar4);
  }
  pTVar3 = TPZCompEl::Reference(cel);
  lVar1 = pTVar3->fIndex;
  if ((this->fGeoToMHMDomain).super_TPZVec<long>.fNElements <= lVar1) {
    local_38 = -1;
    TPZManVector<long,_10>::Resize(&this->fGeoToMHMDomain,lVar1 + 1,&local_38);
    (this->fGeoToMHMDomain).super_TPZVec<long>.fStore[lVar1] = subdomain;
  }
  return;
}

Assistant:

void TPZMHMeshControl::SetSubdomain(TPZCompEl *cel, int64_t subdomain)
{
    int ncon = cel->NConnects();
    for (int ic=0; ic<ncon; ic++) {
        int64_t cindex = cel->ConnectIndex(ic);
        SetSubdomain(cel->Mesh(), cindex, subdomain);
    }
    TPZGeoEl *gel = cel->Reference();
    int64_t index = gel->Index();

    if (index >= fGeoToMHMDomain.size()) {
        fGeoToMHMDomain.Resize(index+1, -1);
        fGeoToMHMDomain[index] = subdomain;
    }
}